

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DExporter.cpp
# Opt level: O0

m3dv_t * AddVrtx(m3dv_t *vrtx,uint32_t *numvrtx,m3dv_t *v,uint32_t *idx)

{
  M3D_FLOAT MVar1;
  M3D_INDEX MVar2;
  m3dv_t *pmVar3;
  m3dv_t *pmVar4;
  uint32_t *idx_local;
  m3dv_t *v_local;
  uint32_t *numvrtx_local;
  m3dv_t *vrtx_local;
  
  if ((v->x == -0.0) && (!NAN(v->x))) {
    v->x = 0.0;
  }
  if ((v->y == -0.0) && (!NAN(v->y))) {
    v->y = 0.0;
  }
  if ((v->z == -0.0) && (!NAN(v->z))) {
    v->z = 0.0;
  }
  if ((v->w == -0.0) && (!NAN(v->w))) {
    v->w = 0.0;
  }
  pmVar3 = (m3dv_t *)realloc(vrtx,(ulong)(*numvrtx + 1) * 0x18);
  pmVar4 = pmVar3 + *numvrtx;
  MVar1 = v->y;
  pmVar4->x = v->x;
  pmVar4->y = MVar1;
  MVar1 = v->w;
  pmVar4->z = v->z;
  pmVar4->w = MVar1;
  MVar2 = v->skinid;
  pmVar4->color = v->color;
  pmVar4->skinid = MVar2;
  *idx = *numvrtx;
  *numvrtx = *numvrtx + 1;
  return pmVar3;
}

Assistant:

m3dv_t *AddVrtx(m3dv_t *vrtx, uint32_t *numvrtx, m3dv_t *v, uint32_t *idx) {
	if (v->x == (M3D_FLOAT)-0.0) v->x = (M3D_FLOAT)0.0;
	if (v->y == (M3D_FLOAT)-0.0) v->y = (M3D_FLOAT)0.0;
	if (v->z == (M3D_FLOAT)-0.0) v->z = (M3D_FLOAT)0.0;
	if (v->w == (M3D_FLOAT)-0.0) v->w = (M3D_FLOAT)0.0;
	vrtx = (m3dv_t *)M3D_REALLOC(vrtx, ((*numvrtx) + 1) * sizeof(m3dv_t));
	memcpy(&vrtx[*numvrtx], v, sizeof(m3dv_t));
	*idx = *numvrtx;
	(*numvrtx)++;
	return vrtx;
}